

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::anon_unknown_0::MaybeEmitHaswordsCheck
               (ChunkIterator it,ChunkIterator end,Options *options,
               vector<int,_std::allocator<int>_> *has_bit_indices,int cached_has_word_index,
               string *from,Printer *p)

{
  pointer ppFVar1;
  Printer *pPVar2;
  pointer this;
  pointer __p;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  pointer __dest;
  HasWordMask HVar7;
  HasWordMask HVar8;
  ChunkIterator it_00;
  FieldChunk *pFVar9;
  FieldChunk *pFVar10;
  size_t __n;
  pointer pHVar11;
  allocator<char> local_189;
  vector<HasWordMask,_std::allocator<HasWordMask>_> hasword_masks;
  int cached_has_word_index_local;
  vector<int,_std::allocator<int>_> *local_158;
  char *local_150;
  size_type local_148;
  char local_140 [8];
  undefined8 uStack_138;
  string *local_130;
  ulong local_128;
  pointer local_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  anon_class_8_1_25a84e30 hasbit_word;
  undefined1 local_e8 [64];
  __index_type local_a8;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  bool local_80;
  bool local_38;
  
  if ((((it._M_current)->has_hasbit == true) &&
      (cached_has_word_index_local = cached_has_word_index, local_158 = has_bit_indices,
      bVar3 = IsProfileDriven(options), 0x20 < (long)end._M_current - (long)it._M_current && bVar3))
     && ((it._M_current)->is_rarely_present == true)) {
    hasbit_word.has_bit_indices = local_158;
    hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pHVar11 = (pointer)0x0;
    local_130 = from;
LAB_001f302d:
    it_00._M_current = it._M_current;
    pPVar2 = p;
    pFVar9 = it_00._M_current;
    if (it_00._M_current != end._M_current) {
      do {
        do {
          pFVar10 = pFVar9;
          pFVar9 = pFVar10 + 1;
          it._M_current = end._M_current;
          if (pFVar9 == end._M_current) goto LAB_001f3082;
          ppFVar1 = ((it_00._M_current)->fields).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while ((ppFVar1 ==
                  ((it_00._M_current)->fields).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) ||
                (pFVar10[1].fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 pFVar10[1].fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish));
        iVar4 = MaybeEmitHaswordsCheck::anon_class_8_1_25a84e30::operator()(&hasbit_word,*ppFVar1);
        iVar5 = MaybeEmitHaswordsCheck::anon_class_8_1_25a84e30::operator()
                          (&hasbit_word,
                           *pFVar10[1].fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
        it._M_current = pFVar9;
      } while (iVar4 == iVar5);
LAB_001f3082:
      do {
        if (it_00._M_current == it._M_current) goto LAB_001f302d;
        ppFVar1 = ((it_00._M_current)->fields).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (ppFVar1 !=
            ((it_00._M_current)->fields).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar4 = MaybeEmitHaswordsCheck::anon_class_8_1_25a84e30::operator()(&hasbit_word,*ppFVar1)
          ;
          uVar6 = GenChunkMask(it_00,it,local_158);
          this = hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>._M_impl
                 .super__Vector_impl_data._M_start;
          if (hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            __n = (long)hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            if (__n == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            local_120 = (pointer)((long)__n >> 3);
            pHVar11 = local_120;
            if (hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>._M_impl.
                super__Vector_impl_data._M_start) {
              pHVar11 = (pointer)0x1;
            }
            local_128 = (long)&local_120->word + (long)&pHVar11->word;
            if (0xffffffffffffffe < local_128) {
              local_128 = 0xfffffffffffffff;
            }
            if (CARRY8((ulong)pHVar11,(ulong)local_120)) {
              local_128 = 0xfffffffffffffff;
            }
            if (local_128 == 0) {
              __dest = (pointer)0x0;
            }
            else {
              __dest = (pointer)operator_new(local_128 * 8);
            }
            __p = local_120;
            HVar8.mask = uVar6;
            HVar8.word = iVar4;
            __dest[(long)local_120] = HVar8;
            if (0 < (long)__n) {
              memmove(__dest,this,__n);
            }
            pHVar11 = (pointer)((long)__dest + __n + 8);
            std::_Vector_base<HasWordMask,_std::allocator<HasWordMask>_>::_M_deallocate
                      ((_Vector_base<HasWordMask,_std::allocator<HasWordMask>_> *)this,__p,
                       (size_t)this);
            hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = __dest + local_128;
            hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>._M_impl.
            super__Vector_impl_data._M_start = __dest;
            hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>._M_impl.
            super__Vector_impl_data._M_finish = pHVar11;
          }
          else {
            HVar7.mask = uVar6;
            HVar7.word = iVar4;
            *hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>._M_impl.
             super__Vector_impl_data._M_finish = HVar7;
            pHVar11 = hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>.
                      _M_impl.super__Vector_impl_data._M_finish + 1;
            hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>._M_impl.
            super__Vector_impl_data._M_finish = pHVar11;
          }
          goto LAB_001f302d;
        }
        it_00._M_current = it_00._M_current + 1;
      } while( true );
    }
    bVar3 = hasword_masks.super__Vector_base<HasWordMask,_std::allocator<HasWordMask>_>._M_impl.
            super__Vector_impl_data._M_start != pHVar11;
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"cond",&local_189);
      local_e8._0_8_ = local_e8 + 0x10;
      if (local_150 == local_140) {
        local_e8._24_8_ = uStack_138;
      }
      else {
        local_e8._0_8_ = local_150;
      }
      local_e8._8_8_ = local_148;
      local_148 = 0;
      local_140[0] = '\0';
      local_108 = (code *)0x0;
      pcStack_100 = (code *)0x0;
      local_118._M_unused._M_object = (void *)0x0;
      local_118._8_8_ = 0;
      local_150 = local_140;
      local_118._M_unused._M_object = operator_new(0x28);
      *(vector<HasWordMask,_std::allocator<HasWordMask>_> **)local_118._M_unused._0_8_ =
           &hasword_masks;
      *(Printer ***)((long)local_118._M_unused._0_8_ + 8) = &p;
      *(int **)((long)local_118._M_unused._0_8_ + 0x10) = &cached_has_word_index_local;
      *(string **)((long)local_118._M_unused._0_8_ + 0x18) = local_130;
      *(code *)((long)local_118._M_unused._0_8_ + 0x20) = (code)0x0;
      pcStack_100 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                    ::_M_invoke;
      local_108 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                ((variant<std::__cxx11::string,std::function<bool()>> *)(local_e8 + 0x20),
                 (function<bool_()> *)&local_118);
      std::_Function_base::~_Function_base((_Function_base *)&local_118);
      local_a0._M_p = (pointer)&local_90;
      local_98 = 0;
      local_90._M_local_buf[0] = '\0';
      local_80 = false;
      if (local_a8 == '\x01') {
        std::__cxx11::string::assign((char *)&local_a0);
      }
      local_38 = false;
      io::Printer::Emit(pPVar2,local_e8,1,0x39,
                        "\n            if (ABSL_PREDICT_FALSE($cond$)) {\n          ");
      io::Printer::Sub::~Sub((Sub *)local_e8);
      std::__cxx11::string::~string((string *)&local_150);
      p->indent_ = p->indent_ + (p->options_).spaces_per_indent;
    }
    std::vector<HasWordMask,_std::allocator<HasWordMask>_>::~vector(&hasword_masks);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool MaybeEmitHaswordsCheck(ChunkIterator it, ChunkIterator end,
                            const Options& options,
                            const std::vector<int>& has_bit_indices,
                            int cached_has_word_index, const std::string& from,
                            io::Printer* p) {
  if (!it->has_hasbit || !IsProfileDriven(options) ||
      std::distance(it, end) < 2 || !it->is_rarely_present) {
    return false;
  }

  auto hasbit_word = [&has_bit_indices](const FieldDescriptor* field) {
    return has_bit_indices[field->index()] / 32;
  };
  auto is_same_hasword = [&](const FieldChunk& a, const FieldChunk& b) {
    // Empty fields are assumed to have the same haswords.
    if (a.fields.empty() || b.fields.empty()) return true;

    return hasbit_word(a.fields.front()) == hasbit_word(b.fields.front());
  };

  struct HasWordMask {
    int word;
    uint32_t mask;
  };

  std::vector<HasWordMask> hasword_masks;
  while (it != end) {
    auto next = FindNextUnequalChunk(it, end, is_same_hasword);
    for (; it != next; ++it) {
      if (!it->fields.empty()) {
        hasword_masks.push_back({hasbit_word(it->fields.front()),
                                 GenChunkMask(it, next, has_bit_indices)});
        break;
      }
    }
    // Jump to the next batch instead.
    it = next;
  }

  if (hasword_masks.empty()) return false;

  // Emit has_bit check for each has_bit_dword index.
  p->Emit({{"cond",
            [&] {
              int first_word = hasword_masks.front().word;
              for (const auto& m : hasword_masks) {
                uint32_t mask = m.mask;
                int this_word = m.word;
                if (this_word != first_word) {
                  p->Emit(R"cc(
                    ||
                  )cc");
                }
                auto v =
                    p->WithVars({{"mask", absl::StrFormat("0x%08xu", mask)}});
                if (this_word == cached_has_word_index) {
                  p->Emit("(cached_has_bits & $mask$) != 0");
                } else {
                  p->Emit({{"from", from}, {"word", this_word}},
                          "($from$_impl_._has_bits_[$word$] & $mask$) != 0");
                }
              }
            }}},
          R"cc(
            if (ABSL_PREDICT_FALSE($cond$)) {
          )cc");
  p->Indent();
  return true;
}